

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall
adios2::format::Buffer::Reset(Buffer *this,bool resetAbsolutePosition,bool zeroInitialize)

{
  byte in_DL;
  byte in_SIL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator *__rhs;
  string local_d8 [32];
  string local_b8 [8];
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  string *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [38];
  byte local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Toolkit",&local_31);
  __rhs = &local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"format::Buffer",__rhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff70,"Reset",(allocator *)&stack0xffffffffffffff6f);
  std::operator+((char *)in_stack_ffffffffffffff58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  std::operator+(in_RDI,(char *)__rhs);
  helper::Throw<std::invalid_argument>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void Buffer::Reset(const bool resetAbsolutePosition, const bool zeroInitialize)
{
    helper::Throw<std::invalid_argument>("Toolkit", "format::Buffer", "Reset",
                                         "buffer memory of type " + m_Type + " can't call Reset");
}